

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O2

int gdTransformAffineBoundingBox(gdRectPtr src,double *affine,gdRectPtr bbox)

{
  gdPointFPtr dst;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  long lVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  gdPointF local_a8;
  double local_98;
  undefined8 local_90;
  undefined1 local_88 [16];
  undefined8 local_78;
  double local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  gdPointF point;
  
  local_a8.x = 0.0;
  local_a8.y = 0.0;
  local_90 = 0;
  uVar1 = src->width;
  uVar2 = src->height;
  local_70 = (double)(int)uVar2;
  local_98 = (double)(int)uVar1;
  local_88._8_4_ = SUB84(local_70,0);
  local_88._0_8_ = (double)(int)uVar1;
  local_88._12_4_ = (int)((ulong)local_70 >> 0x20);
  local_78 = 0;
  lVar5 = 0;
  do {
    if (lVar5 + 0x10 == 0x50) {
      uVar6 = SUB84(local_a8.x,0);
      uVar7 = (undefined4)((ulong)local_a8.x >> 0x20);
      uVar8 = SUB84(local_a8.y,0);
      uVar9 = (undefined4)((ulong)local_a8.y >> 0x20);
      dVar11 = local_a8.x;
      dVar13 = local_a8.y;
      for (lVar5 = 0x10; lVar5 != 0x40; lVar5 = lVar5 + 0x10) {
        auVar10 = *(undefined1 (*) [16])((long)&local_a8.x + lVar5);
        auVar12._8_8_ = dVar13;
        auVar12._0_8_ = dVar11;
        auVar12 = minpd(auVar10,auVar12);
        auVar3._4_4_ = uVar7;
        auVar3._0_4_ = uVar6;
        auVar3._8_4_ = uVar8;
        auVar3._12_4_ = uVar9;
        auVar10 = maxpd(auVar10,auVar3);
        uVar6 = auVar10._0_4_;
        uVar7 = auVar10._4_4_;
        uVar8 = auVar10._8_4_;
        uVar9 = auVar10._12_4_;
        dVar11 = auVar12._0_8_;
        dVar13 = auVar12._8_8_;
      }
      local_48 = CONCAT44((int)dVar13,(int)dVar11);
      uStack_40 = 0;
      dVar11 = (double)CONCAT44(uVar7,uVar6) - dVar11;
      dVar13 = (double)CONCAT44(uVar9,uVar8) - dVar13;
      local_68._8_4_ = SUB84(dVar13,0);
      local_68._0_8_ = dVar11;
      local_68._12_4_ = (int)((ulong)dVar13 >> 0x20);
      dVar11 = ceil(dVar11);
      local_58._8_4_ = extraout_XMM0_Dc;
      local_58._0_8_ = dVar11;
      local_58._12_4_ = extraout_XMM0_Dd;
      dVar11 = ceil((double)local_68._8_8_);
      bbox->x = (undefined4)local_48;
      bbox->y = local_48._4_4_;
      bbox->width = (int)(double)local_58._0_8_ + 1;
      bbox->height = (int)dVar11 + 1;
      return 1;
    }
    dst = (gdPointFPtr)((long)&local_a8.x + lVar5);
    point.x = dst->x;
    point.y = *(double *)((long)&local_a8.y + lVar5);
    iVar4 = gdAffineApplyToPointF(dst,&point,affine);
    lVar5 = lVar5 + 0x10;
  } while (iVar4 == 1);
  return 0;
}

Assistant:

BGD_DECLARE(int) gdTransformAffineBoundingBox(gdRectPtr src, const double affine[6], gdRectPtr bbox)
{
	gdPointF extent[4], min, max, point;
	int i;

	extent[0].x=0.0;
	extent[0].y=0.0;
	extent[1].x=(double) src->width;
	extent[1].y=0.0;
	extent[2].x=(double) src->width;
	extent[2].y=(double) src->height;
	extent[3].x=0.0;
	extent[3].y=(double) src->height;

	for (i=0; i < 4; i++) {
		point=extent[i];
		if (gdAffineApplyToPointF(&extent[i], &point, affine) != GD_TRUE) {
			return GD_FALSE;
		}
	}
	min=extent[0];
	max=extent[0];

	for (i=1; i < 4; i++) {
		if (min.x > extent[i].x)
			min.x=extent[i].x;
		if (min.y > extent[i].y)
			min.y=extent[i].y;
		if (max.x < extent[i].x)
			max.x=extent[i].x;
		if (max.y < extent[i].y)
			max.y=extent[i].y;
	}
	bbox->x = (int) min.x;
	bbox->y = (int) min.y;
	bbox->width  = (int) ceil((max.x - min.x)) + 1;
	bbox->height = (int) ceil(max.y - min.y) + 1;

	return GD_TRUE;
}